

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

pointer __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::data
          (QList<QStyleOptionViewItem::ViewItemPosition> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,
               (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *)0x0);
  }
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }